

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

int __thiscall iDynTree::Model::copy(Model *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  size_t sVar1;
  Model *this_00;
  Model *pMVar2;
  SensorsList *pSVar3;
  IJointConstPtr in_stack_00000068;
  string *in_stack_00000070;
  Model *in_stack_00000078;
  LinkIndex in_stack_00000080;
  Model *in_stack_00000088;
  FrameIndex in_stack_00000090;
  Transform link_H_frame;
  FrameIndex in_stack_000000a0;
  Model *in_stack_000000a8;
  string frameName;
  string linkName;
  uint addFrm;
  uint jnt;
  uint lnk;
  SensorsList *in_stack_fffffffffffffe98;
  Model *in_stack_fffffffffffffea8;
  Transform local_130 [96];
  Transform local_d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff40;
  string local_60 [8];
  Link *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  Model *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  Model *in_stack_ffffffffffffffc8;
  uint local_1c;
  uint local_18;
  uint local_14;
  
  this->defaultBaseLink = LINK_INVALID_INDEX;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_14 = 0;
  while( true ) {
    sVar1 = getNrOfLinks((Model *)0x447114);
    if (sVar1 <= local_14) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(dst + 0x68),(ulong)local_14);
    std::vector<iDynTree::Link,_std::allocator<iDynTree::Link>_>::operator[]
              ((vector<iDynTree::Link,_std::allocator<iDynTree::Link>_> *)(dst + 8),(ulong)local_14)
    ;
    addLink(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_14 = local_14 + 1;
  }
  this->nrOfPosCoords = 0;
  this->nrOfDOFs = 0;
  local_18 = 0;
  while( true ) {
    sVar1 = getNrOfJoints((Model *)0x4471bf);
    if (sVar1 <= local_18) break;
    in_stack_fffffffffffffea8 =
         (Model *)std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)(dst + 0x80),(ulong)local_18);
    std::vector<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_>::operator[]
              ((vector<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_> *)(dst + 0x20),
               (ulong)local_18);
    addJoint(in_stack_00000078,in_stack_00000070,in_stack_00000068);
    local_18 = local_18 + 1;
  }
  sVar1 = getNrOfLinks((Model *)0x44723d);
  local_1c = (uint)sVar1;
  while( true ) {
    this_00 = (Model *)(ulong)local_1c;
    pMVar2 = (Model *)getNrOfFrames(this_00);
    if (pMVar2 <= this_00) break;
    in_stack_fffffffffffffe98 = (SensorsList *)dst;
    getFrameLink(_link_H_frame,in_stack_00000090);
    getLinkName_abi_cxx11_(in_stack_00000088,in_stack_00000080);
    getFrameName_abi_cxx11_(in_stack_000000a8,in_stack_000000a0);
    getFrameTransform(in_stack_000000a8,in_stack_000000a0);
    iDynTree::Transform::Transform(local_130,local_d0);
    addAdditionalFrameToLink
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
               (string *)in_stack_ffffffffffffffb8,(Transform *)in_stack_ffffffffffffffb0);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
    local_1c = local_1c + 1;
  }
  getDefaultBaseLink((Model *)dst);
  setDefaultBaseLink(in_stack_fffffffffffffea8,(LinkIndex)this_00);
  ModelSolidShapes::operator=
            ((ModelSolidShapes *)this_00,(ModelSolidShapes *)in_stack_fffffffffffffe98);
  ModelSolidShapes::operator=
            ((ModelSolidShapes *)this_00,(ModelSolidShapes *)in_stack_fffffffffffffe98);
  pSVar3 = SensorsList::operator=((SensorsList *)this_00,in_stack_fffffffffffffe98);
  return (int)pSVar3;
}

Assistant:

void Model::copy(const Model& other)
{
    // reset the base link, the real one will be copied later
    this->defaultBaseLink = LINK_INVALID_INDEX;

    this->packageDirs = other.packageDirs;

    // Add all the links, preserving the numbering
    for(unsigned int lnk=0; lnk < other.getNrOfLinks(); lnk++ )
    {
        this->addLink(other.linkNames[lnk],other.links[lnk]);
    }

    // Add all joints, preserving the numbering
    // reset the nrOfDOFs (it will be then update in addJoint)
    nrOfPosCoords = 0;
    nrOfDOFs = 0;

    for(unsigned int jnt=0; jnt < other.getNrOfJoints(); jnt++ )
    {
        this->addJoint(other.jointNames[jnt],other.joints[jnt]);
    }

    // Add all additional frames, preserving the numbering
    for(unsigned int addFrm=other.getNrOfLinks(); addFrm < other.getNrOfFrames(); addFrm++ )
    {
        std::string linkName = other.getLinkName(other.getFrameLink(addFrm));
        std::string frameName = other.getFrameName(addFrm);
        Transform link_H_frame = other.getFrameTransform(addFrm);
        this->addAdditionalFrameToLink(linkName,frameName,link_H_frame);
    }

    // Copy the default base link
    this->setDefaultBaseLink(other.getDefaultBaseLink());

    // Copy the solid shapes
    this->m_collisionSolidShapes = other.m_collisionSolidShapes;
    this->m_visualSolidShapes    = other.m_visualSolidShapes;

    // Copy the sensors
    this->m_sensors = other.m_sensors;
}